

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::IsPathIncluded
               (CollectionMembershipQuery *query,Stage *stage,Path *abs_path,
               ExpansionRule expansionRule)

{
  bool bVar1;
  ExpansionRule expansionRule_local;
  Path *abs_path_local;
  Stage *stage_local;
  CollectionMembershipQuery *query_local;
  
  bVar1 = Path::is_valid(abs_path);
  if (bVar1) {
    bVar1 = Path::is_root_path(abs_path);
    if (bVar1) {
      query_local._7_1_ = true;
    }
    else {
      query_local._7_1_ = false;
    }
  }
  else {
    query_local._7_1_ = false;
  }
  return query_local._7_1_;
}

Assistant:

bool IsPathIncluded(const CollectionMembershipQuery &query, const Stage &stage,
                    const Path &abs_path,
                    const CollectionInstance::ExpansionRule expansionRule) {
  (void)query;
  (void)stage;
  (void)expansionRule;

  DCOUT("TODO");

  if (!abs_path.is_valid()) {
    return false;
  }

  if (abs_path.is_root_path()) {
    return true;
  }

  return false;
}